

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall Parser::check_type_exists(Parser *this)

{
  Tokenizer *pTVar1;
  const_iterator cVar2;
  long *plVar3;
  long *plVar4;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pTVar1 = this->tokenizer;
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(pTVar1->type_map)._M_t,&this->cur_token);
  if ((_Rb_tree_header *)cVar2._M_node != &(pTVar1->type_map)._M_t._M_impl.super__Rb_tree_header) {
    return;
  }
  std::operator+(&local_30,"Compiler Error: \'",&this->cur_token);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_30);
  local_50 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_50 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::operator<<((ostream *)&std::cerr,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  exit(0);
}

Assistant:

void Parser::check_type_exists() {
    // types defined by language + user defined types
    if (!tokenizer.type_exists(cur_token)) {
        std::cerr << "Compiler Error: '" + cur_token + "' is not a valid type";
        exit(0);
    }
}